

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O3

MaybeResult<wasm::Ok> *
wasm::WATParser::params<wasm::WATParser::ParseDeclsCtx>
          (MaybeResult<wasm::Ok> *__return_storage_ptr__,ParseDeclsCtx *ctx,bool allowNames)

{
  undefined1 *puVar1;
  size_t pos;
  undefined8 uVar2;
  bool bVar3;
  MaybeResult<wasm::Ok> *pMVar4;
  string_view expected;
  string_view expected_00;
  undefined1 local_100 [8];
  optional<wasm::Name> id;
  long local_d8 [2];
  string local_c8;
  undefined1 local_a8 [8];
  Result<wasm::Ok> type;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined1 local_60 [8];
  Result<wasm::Ok> _val;
  
  expected._M_str = "param";
  expected._M_len = 5;
  bVar3 = Lexer::takeSExprStart(&ctx->in,expected);
  _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
  _32_8_ = __return_storage_ptr__;
  if (bVar3) {
    do {
      pos = (ctx->in).pos;
      Lexer::takeID((optional<wasm::Name> *)local_100,&ctx->in);
      if (id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Name>._M_payload._8_1_ == '\0') {
        while (bVar3 = Lexer::takeRParen(&ctx->in), !bVar3) {
          valtype<wasm::WATParser::ParseDeclsCtx>((Result<wasm::Ok> *)local_a8,ctx);
          std::__detail::__variant::_Copy_ctor_base<false,_wasm::Ok,_wasm::Err>::_Copy_ctor_base
                    ((_Copy_ctor_base<false,_wasm::Ok,_wasm::Err> *)local_60,
                     (_Copy_ctor_base<false,_wasm::Ok,_wasm::Err> *)local_a8);
          if (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
            type.val.super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_ = &local_70;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)
                       ((long)&type.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),local_60,
                       (undefined1 *)
                       (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                        super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_ +
                       (long)local_60));
            goto LAB_00b86e04;
          }
          std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                    ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_60);
          std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                    ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_a8);
        }
      }
      else {
        if (!allowNames) {
          id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Name>._16_8_ = local_d8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     &id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                      super__Optional_payload_base<wasm::Name>._M_engaged,
                     "unexpected named parameter","");
          Lexer::err((Err *)local_a8,&ctx->in,pos,
                     (string *)
                     &id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                      super__Optional_payload_base<wasm::Name>._M_engaged);
          uVar2 = _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                  super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_;
          *(undefined8 **)
           _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>
           .super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
           super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_ =
               (undefined8 *)
               (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_ + 0x10);
          puVar1 = (undefined1 *)
                   ((long)&type.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 8);
          if (local_a8 == (undefined1  [8])puVar1) {
            *(undefined8 *)
             (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_ + 0x10) =
                 CONCAT71(type.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                          super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._9_7_,
                          type.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                          super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_1_);
            *(undefined8 *)
             (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_ + 0x18) =
                 type.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._16_8_;
          }
          else {
            *(undefined1 (*) [8])
             _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>
             .super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_ = local_a8;
            *(ulong *)(_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_ + 0x10) =
                 CONCAT71(type.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                          super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._9_7_,
                          type.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                          super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_1_);
          }
          *(undefined8 *)
           (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_ + 8) =
               type.val.super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_;
          type.val.super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_ = 0;
          type.val.super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_1_ = 0;
          *(undefined1 *)
           (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_ + 0x20) = 2;
          if ((long *)id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                      super__Optional_payload_base<wasm::Name>._16_8_ == local_d8) {
            return (MaybeResult<wasm::Ok> *)
                   _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_;
          }
          local_a8 = (undefined1  [8])puVar1;
          operator_delete((void *)id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                                  super__Optional_payload_base<wasm::Name>._16_8_,local_d8[0] + 1);
          return (MaybeResult<wasm::Ok> *)uVar2;
        }
        valtype<wasm::WATParser::ParseDeclsCtx>((Result<wasm::Ok> *)local_a8,ctx);
        std::__detail::__variant::_Copy_ctor_base<false,_wasm::Ok,_wasm::Err>::_Copy_ctor_base
                  ((_Copy_ctor_base<false,_wasm::Ok,_wasm::Err> *)local_60,
                   (_Copy_ctor_base<false,_wasm::Ok,_wasm::Err> *)local_a8);
        if (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
          type.val.super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_ = &local_70;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)
                     ((long)&type.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),local_60,
                     (undefined1 *)
                     (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                      super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                      super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_ + (long)local_60)
                    );
LAB_00b86e04:
          pMVar4 = (MaybeResult<wasm::Ok> *)
                   _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_;
          *(undefined8 **)
           _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>
           .super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
           super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_ =
               (undefined8 *)
               (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_ + 0x10);
          if ((undefined8 *)
              type.val.super__Variant_base<wasm::Ok,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_ == &local_70) {
            *(undefined8 *)
             (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_ + 0x10) = local_70;
            *(undefined8 *)
             (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_ + 0x18) = uStack_68;
          }
          else {
            *(undefined8 *)
             _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>
             .super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_ =
                 type.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_;
            *(undefined8 *)
             (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_ + 0x10) = local_70;
          }
          *(undefined8 *)
           (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_ + 8) = local_78;
          *(undefined1 *)
           (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_ + 0x20) = 2;
          std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                    ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_60);
LAB_00b86e47:
          std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                    ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_a8);
          return pMVar4;
        }
        std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_60);
        bVar3 = Lexer::takeRParen(&ctx->in);
        if (!bVar3) {
          local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_c8,"expected end of param","");
          Lexer::err((Err *)local_60,&ctx->in,&local_c8);
          pMVar4 = (MaybeResult<wasm::Ok> *)
                   _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_;
          *(undefined8 **)
           _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>
           .super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
           super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_ =
               (undefined8 *)
               (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_ + 0x10);
          puVar1 = (undefined1 *)
                   ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 8);
          if (local_60 == (undefined1  [8])puVar1) {
            *(undefined8 *)
             (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_ + 0x10) =
                 CONCAT71(_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                          super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._9_7_,
                          _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                          super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_1_);
            *(undefined8 *)
             (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_ + 0x18) =
                 _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._16_8_;
          }
          else {
            *(undefined1 (*) [8])
             _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>
             .super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_ = local_60;
            *(ulong *)(_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_ + 0x10) =
                 CONCAT71(_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                          super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._9_7_,
                          _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                          super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_1_);
          }
          *(undefined8 *)
           (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_ + 8) =
               _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_;
          _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_ = 0;
          _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_1_ = 0;
          *(undefined1 *)
           (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_ + 0x20) = 2;
          local_60 = (undefined1  [8])puVar1;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
            operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
          }
          goto LAB_00b86e47;
        }
        std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_a8);
      }
      expected_00._M_str = "param";
      expected_00._M_len = 5;
      bVar3 = Lexer::takeSExprStart(&ctx->in,expected_00);
    } while (bVar3);
    *(undefined1 *)
     (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_ + 0x20) = 0;
  }
  else {
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x01';
  }
  return (MaybeResult<wasm::Ok> *)
         _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
         super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>
         .super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
         super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_;
}

Assistant:

MaybeResult<typename Ctx::ParamsT> params(Ctx& ctx, bool allowNames) {
  bool hasAny = false;
  auto res = ctx.makeParams();
  while (ctx.in.takeSExprStart("param"sv)) {
    hasAny = true;
    auto pos = ctx.in.getPos();
    if (auto id = ctx.in.takeID()) {
      // Single named param
      if (!allowNames) {
        return ctx.in.err(pos, "unexpected named parameter");
      }
      auto type = valtype(ctx);
      CHECK_ERR(type);
      if (!ctx.in.takeRParen()) {
        return ctx.in.err("expected end of param");
      }
      ctx.appendParam(res, *id, *type);
    } else {
      // Repeated unnamed params
      while (!ctx.in.takeRParen()) {
        auto type = valtype(ctx);
        CHECK_ERR(type);
        ctx.appendParam(res, {}, *type);
      }
    }
  }
  if (hasAny) {
    return res;
  }
  return {};
}